

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O3

int Abc_NtkCollectPiPos_int(Abc_Obj_t *pBox,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLiMaps,Vec_Ptr_t *vLoMaps)

{
  undefined4 uVar1;
  long *plVar2;
  long lVar3;
  void *pvVar4;
  int *__s;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  int iVar9;
  Vec_Ptr_t *extraout_RDX;
  Vec_Ptr_t *extraout_RDX_00;
  Vec_Ptr_t *extraout_RDX_01;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  pVVar7 = vLiMaps;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar8 = pNtk->vObjs->nSize;
    uVar12 = (long)iVar8 + 500;
    iVar9 = (int)uVar12;
    if ((pNtk->vTravIds).nCap < iVar9) {
      __s = (int *)malloc(uVar12 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar9;
      pVVar7 = extraout_RDX;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar8) {
      memset(__s,0,(uVar12 & 0xffffffff) << 2);
      pVVar7 = extraout_RDX_00;
    }
    (pNtk->vTravIds).nSize = iVar9;
  }
  iVar8 = pNtk->nTravIds;
  pNtk->nTravIds = iVar8 + 1;
  if (0x3ffffffe < iVar8) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar6 = pNtk->vPis;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      plVar2 = *(long **)(*(long *)(*(long *)(*pVVar6->pArray[lVar11] + 0x20) + 8) +
                         (long)**(int **)((long)pVVar6->pArray[lVar11] + 0x30) * 8);
      lVar3 = *plVar2;
      iVar8 = (int)plVar2[2];
      uVar1 = *(undefined4 *)(lVar3 + 0xd8);
      Vec_IntFillExtra((Vec_Int_t *)(lVar3 + 0xe0),iVar8 + 1,(int)pVVar7);
      if (((long)iVar8 < 0) || (*(int *)(lVar3 + 0xe4) <= iVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar3 + 0xe8) + (long)iVar8 * 4) = uVar1;
      lVar11 = lVar11 + 1;
      pVVar6 = pNtk->vPis;
      pVVar7 = extraout_RDX_01;
    } while (lVar11 < pVVar6->nSize);
  }
  if (pBox == (Abc_Obj_t *)0x0) {
    pVVar7 = pNtk->vPos;
    if (pVVar7->nSize < 1) {
      return 0;
    }
  }
  else {
    if (0 < (pBox->vFanins).nSize) {
      uVar12 = (ulong)(uint)vLiMaps->nCap;
      iVar8 = vLiMaps->nSize;
      lVar11 = 0;
      do {
        pvVar4 = pBox->pNtk->vObjs->pArray[(pBox->vFanins).pArray[lVar11]];
        iVar9 = (int)uVar12;
        if (iVar8 == iVar9) {
          if (iVar9 < 0x10) {
            if (vLiMaps->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vLiMaps->pArray,0x80);
            }
            vLiMaps->pArray = ppvVar5;
            vLiMaps->nCap = 0x10;
            uVar12 = 0x10;
          }
          else {
            uVar12 = (ulong)(uint)(iVar9 * 2);
            if (vLiMaps->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(uVar12 * 8);
            }
            else {
              ppvVar5 = (void **)realloc(vLiMaps->pArray,uVar12 * 8);
            }
            vLiMaps->pArray = ppvVar5;
            vLiMaps->nCap = iVar9 * 2;
          }
        }
        else {
          ppvVar5 = vLiMaps->pArray;
        }
        iVar9 = vLiMaps->nSize;
        iVar8 = iVar9 + 1;
        vLiMaps->nSize = iVar8;
        ppvVar5[iVar9] = pvVar4;
        lVar11 = lVar11 + 1;
      } while (lVar11 < (pBox->vFanins).nSize);
      pVVar6 = pNtk->vPis;
    }
    if (0 < pVVar6->nSize) {
      uVar12 = (ulong)(uint)vLoMaps->nCap;
      iVar8 = vLoMaps->nSize;
      lVar11 = 0;
      do {
        pvVar4 = pVVar6->pArray[lVar11];
        iVar9 = (int)uVar12;
        if (iVar8 == iVar9) {
          if (iVar9 < 0x10) {
            if (vLoMaps->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vLoMaps->pArray,0x80);
            }
            vLoMaps->pArray = ppvVar5;
            vLoMaps->nCap = 0x10;
            uVar12 = 0x10;
          }
          else {
            uVar12 = (ulong)(uint)(iVar9 * 2);
            if (vLoMaps->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(uVar12 * 8);
            }
            else {
              ppvVar5 = (void **)realloc(vLoMaps->pArray,uVar12 * 8);
            }
            vLoMaps->pArray = ppvVar5;
            vLoMaps->nCap = iVar9 * 2;
          }
        }
        else {
          ppvVar5 = vLoMaps->pArray;
        }
        iVar9 = vLoMaps->nSize;
        iVar8 = iVar9 + 1;
        vLoMaps->nSize = iVar8;
        ppvVar5[iVar9] = pvVar4;
        lVar11 = lVar11 + 1;
        pVVar6 = pNtk->vPis;
      } while (lVar11 < pVVar6->nSize);
    }
    pVVar7 = pNtk->vPos;
    if (pVVar7->nSize < 1) {
      iVar8 = 0;
      if (pBox == (Abc_Obj_t *)0x0) {
        return 0;
      }
      goto LAB_001b8412;
    }
  }
  lVar11 = 0;
  iVar8 = 0;
  do {
    iVar9 = Abc_NtkCollectPiPos_rec
                      (*(Abc_Obj_t **)
                        (*(long *)(*(long *)(*pVVar7->pArray[lVar11] + 0x20) + 8) +
                        (long)**(int **)((long)pVVar7->pArray[lVar11] + 0x20) * 8),vLiMaps,vLoMaps);
    iVar8 = iVar8 + iVar9;
    lVar11 = lVar11 + 1;
    pVVar7 = pNtk->vPos;
  } while (lVar11 < pVVar7->nSize);
  if (pBox == (Abc_Obj_t *)0x0) {
    return iVar8;
  }
  if (0 < pVVar7->nSize) {
    uVar12 = (ulong)(uint)vLiMaps->nCap;
    iVar9 = vLiMaps->nSize;
    lVar11 = 0;
    do {
      pvVar4 = pVVar7->pArray[lVar11];
      iVar10 = (int)uVar12;
      if (iVar9 == iVar10) {
        if (iVar10 < 0x10) {
          if (vLiMaps->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vLiMaps->pArray,0x80);
          }
          vLiMaps->pArray = ppvVar5;
          vLiMaps->nCap = 0x10;
          uVar12 = 0x10;
        }
        else {
          uVar12 = (ulong)(uint)(iVar10 * 2);
          if (vLiMaps->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(uVar12 * 8);
          }
          else {
            ppvVar5 = (void **)realloc(vLiMaps->pArray,uVar12 * 8);
          }
          vLiMaps->pArray = ppvVar5;
          vLiMaps->nCap = iVar10 * 2;
        }
      }
      else {
        ppvVar5 = vLiMaps->pArray;
      }
      iVar10 = vLiMaps->nSize;
      iVar9 = iVar10 + 1;
      vLiMaps->nSize = iVar9;
      ppvVar5[iVar10] = pvVar4;
      lVar11 = lVar11 + 1;
      pVVar7 = pNtk->vPos;
    } while (lVar11 < pVVar7->nSize);
  }
LAB_001b8412:
  if (0 < (pBox->vFanouts).nSize) {
    uVar12 = (ulong)(uint)vLoMaps->nCap;
    iVar9 = vLoMaps->nSize;
    lVar11 = 0;
    do {
      pvVar4 = pBox->pNtk->vObjs->pArray[(pBox->vFanouts).pArray[lVar11]];
      iVar10 = (int)uVar12;
      if (iVar9 == iVar10) {
        if (iVar10 < 0x10) {
          if (vLoMaps->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vLoMaps->pArray,0x80);
          }
          vLoMaps->pArray = ppvVar5;
          vLoMaps->nCap = 0x10;
          uVar12 = 0x10;
        }
        else {
          uVar12 = (ulong)(uint)(iVar10 * 2);
          if (vLoMaps->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(uVar12 * 8);
          }
          else {
            ppvVar5 = (void **)realloc(vLoMaps->pArray,uVar12 * 8);
          }
          vLoMaps->pArray = ppvVar5;
          vLoMaps->nCap = iVar10 * 2;
        }
      }
      else {
        ppvVar5 = vLoMaps->pArray;
      }
      iVar10 = vLoMaps->nSize;
      iVar9 = iVar10 + 1;
      vLoMaps->nSize = iVar9;
      ppvVar5[iVar10] = pvVar4;
      lVar11 = lVar11 + 1;
    } while (lVar11 < (pBox->vFanouts).nSize);
  }
  return iVar8 + 1;
}

Assistant:

int Abc_NtkCollectPiPos_int( Abc_Obj_t * pBox, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLiMaps, Vec_Ptr_t * vLoMaps )
{
    Abc_Obj_t * pObj; 
    int i, Counter = 0;
    // mark primary inputs
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(pObj) );
    // add primary inputs
    if ( pBox )
    {
        Abc_ObjForEachFanin( pBox, pObj, i )
            Vec_PtrPush( vLiMaps, pObj );
        Abc_NtkForEachPi( pNtk, pObj, i )
            Vec_PtrPush( vLoMaps, pObj );
    }
    // visit primary outputs
    Abc_NtkForEachPo( pNtk, pObj, i )
        Counter += Abc_NtkCollectPiPos_rec( Abc_ObjFanin0(pObj), vLiMaps, vLoMaps );
    // add primary outputs
    if ( pBox )
    {
        Abc_NtkForEachPo( pNtk, pObj, i )
            Vec_PtrPush( vLiMaps, pObj );
        Abc_ObjForEachFanout( pBox, pObj, i )
            Vec_PtrPush( vLoMaps, pObj );
        Counter++;
    }
    return Counter;
}